

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayMethods.cpp
# Opt level: O0

bool slang::ast::builtins::isComparable(Type *type)

{
  bool bVar1;
  undefined7 in_stack_fffffffffffffff0;
  undefined1 in_stack_fffffffffffffff7;
  bool bVar2;
  
  bVar1 = Type::isNumeric((Type *)CONCAT17(in_stack_fffffffffffffff7,in_stack_fffffffffffffff0));
  bVar2 = true;
  if (!bVar1) {
    bVar2 = Type::isString((Type *)0x72117a);
  }
  return bVar2;
}

Assistant:

static bool isComparable(const Type& type) {
    return type.isNumeric() || type.isString();
}